

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.hpp
# Opt level: O2

void __thiscall tfs::TMatrix<double>::randomize(TMatrix<double> *this,DNN_NUMERIC scale)

{
  double *pdVar1;
  bool bVar2;
  double *pdVar3;
  DNN_NUMERIC DVar4;
  double dVar5;
  
  bVar2 = isEmpty(this);
  if (bVar2) {
    report_problem("Error",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/../src/Matrix.hpp"
                   ,"randomize",0x5e,"empty matrix");
    return;
  }
  dVar5 = 1.0;
  if (1.0 <= scale) {
    dVar5 = scale;
  }
  pdVar1 = this->m_end;
  for (pdVar3 = this->m_data; pdVar3 < pdVar1; pdVar3 = pdVar3 + 1) {
    DVar4 = randomGauss();
    *pdVar3 = DVar4 * SQRT(1.0 / dVar5);
  }
  return;
}

Assistant:

inline void randomize( DNN_NUMERIC scale ) {             // Fill matrix with small positive values
            // Weight normalization is done to equalize the output variance of every neuron,
            // otherwise neurons with a lot of incoming connections will have outputs with a larger variance
            if( isEmpty()) {
                log_error( "empty matrix" );
                return;
            }
            if( scale < 1.0 ) {
                scale = 1.0;
            }
            const DNN_NUMERIC max = sqrt( 1.0 / scale );
                  T *         ptr = m_data;
            const T * const   end = m_end;
            while( ptr < end ) {
                *ptr++ = (T) randn( max );
            }
        }